

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int backupOnePage(sqlite3_backup *p,Pgno iSrcPg,u8 *zSrcData,int bUpdate)

{
  int iVar1;
  Pgno PVar2;
  u8 *__src;
  void *pvVar3;
  undefined1 *puVar4;
  int local_84;
  u8 *zOut;
  u8 *zDestData;
  u8 *zIn;
  PgHdr *pPStack_60;
  Pgno iDest;
  DbPage *pDestPg;
  i64 iOff;
  long lStack_48;
  int rc;
  i64 iEnd;
  int local_38;
  int nCopy;
  int nDestPgsz;
  int nSrcPgsz;
  Pager *pDestPager;
  u8 *puStack_20;
  int bUpdate_local;
  u8 *zSrcData_local;
  sqlite3_backup *psStack_10;
  Pgno iSrcPg_local;
  sqlite3_backup *p_local;
  
  pDestPager._4_4_ = bUpdate;
  puStack_20 = zSrcData;
  zSrcData_local._4_4_ = iSrcPg;
  psStack_10 = p;
  _nDestPgsz = sqlite3BtreePager(p->pDest);
  nCopy = sqlite3BtreeGetPageSize(psStack_10->pSrc);
  local_38 = sqlite3BtreeGetPageSize(psStack_10->pDest);
  local_84 = local_38;
  if (nCopy < local_38) {
    local_84 = nCopy;
  }
  iEnd._4_4_ = local_84;
  lStack_48 = (ulong)zSrcData_local._4_4_ * (long)nCopy;
  iOff._4_4_ = 0;
  if ((nCopy != local_38) && (iVar1 = sqlite3PagerIsMemdb(_nDestPgsz), iVar1 != 0)) {
    iOff._4_4_ = 8;
  }
  for (pDestPg = (DbPage *)(lStack_48 - nCopy); iOff._4_4_ == 0 && (long)pDestPg < lStack_48;
      pDestPg = (DbPage *)((long)&pDestPg->pPage + (long)local_38)) {
    pPStack_60 = (PgHdr *)0x0;
    PVar2 = (int)((long)pDestPg / (long)local_38) + 1;
    if (PVar2 != (uint)sqlite3PendingByte / psStack_10->pDest->pBt->pageSize + 1) {
      iOff._4_4_ = sqlite3PagerGet(_nDestPgsz,PVar2,&stack0xffffffffffffffa0,0);
      if ((iOff._4_4_ == 0) && (iOff._4_4_ = sqlite3PagerWrite(pPStack_60), iOff._4_4_ == 0)) {
        __src = puStack_20 + (long)pDestPg % (long)nCopy;
        pvVar3 = sqlite3PagerGetData(pPStack_60);
        pvVar3 = (void *)((long)pvVar3 + (long)pDestPg % (long)local_38);
        memcpy(pvVar3,__src,(long)iEnd._4_4_);
        puVar4 = (undefined1 *)sqlite3PagerGetExtra(pPStack_60);
        *puVar4 = 0;
        if ((pDestPg == (DbPage *)0x0) && (pDestPager._4_4_ == 0)) {
          PVar2 = sqlite3BtreeLastPage(psStack_10->pSrc);
          sqlite3Put4byte((uchar *)((long)pvVar3 + 0x1c),PVar2);
        }
      }
      sqlite3PagerUnref(pPStack_60);
    }
  }
  return iOff._4_4_;
}

Assistant:

static int backupOnePage(
  sqlite3_backup *p,              /* Backup handle */
  Pgno iSrcPg,                    /* Source database page to backup */
  const u8 *zSrcData,             /* Source database page data */
  int bUpdate                     /* True for an update, false otherwise */
){
  Pager * const pDestPager = sqlite3BtreePager(p->pDest);
  const int nSrcPgsz = sqlite3BtreeGetPageSize(p->pSrc);
  int nDestPgsz = sqlite3BtreeGetPageSize(p->pDest);
  const int nCopy = MIN(nSrcPgsz, nDestPgsz);
  const i64 iEnd = (i64)iSrcPg*(i64)nSrcPgsz;
  int rc = SQLITE_OK;
  i64 iOff;

  assert( sqlite3BtreeGetReserveNoMutex(p->pSrc)>=0 );
  assert( p->bDestLocked );
  assert( !isFatalError(p->rc) );
  assert( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) );
  assert( zSrcData );

  /* Catch the case where the destination is an in-memory database and the
  ** page sizes of the source and destination differ.
  */
  if( nSrcPgsz!=nDestPgsz && sqlite3PagerIsMemdb(pDestPager) ){
    rc = SQLITE_READONLY;
  }

  /* This loop runs once for each destination page spanned by the source
  ** page. For each iteration, variable iOff is set to the byte offset
  ** of the destination page.
  */
  for(iOff=iEnd-(i64)nSrcPgsz; rc==SQLITE_OK && iOff<iEnd; iOff+=nDestPgsz){
    DbPage *pDestPg = 0;
    Pgno iDest = (Pgno)(iOff/nDestPgsz)+1;
    if( iDest==PENDING_BYTE_PAGE(p->pDest->pBt) ) continue;
    if( SQLITE_OK==(rc = sqlite3PagerGet(pDestPager, iDest, &pDestPg, 0))
     && SQLITE_OK==(rc = sqlite3PagerWrite(pDestPg))
    ){
      const u8 *zIn = &zSrcData[iOff%nSrcPgsz];
      u8 *zDestData = sqlite3PagerGetData(pDestPg);
      u8 *zOut = &zDestData[iOff%nDestPgsz];

      /* Copy the data from the source page into the destination page.
      ** Then clear the Btree layer MemPage.isInit flag. Both this module
      ** and the pager code use this trick (clearing the first byte
      ** of the page 'extra' space to invalidate the Btree layers
      ** cached parse of the page). MemPage.isInit is marked
      ** "MUST BE FIRST" for this purpose.
      */
      memcpy(zOut, zIn, nCopy);
      ((u8 *)sqlite3PagerGetExtra(pDestPg))[0] = 0;
      if( iOff==0 && bUpdate==0 ){
        sqlite3Put4byte(&zOut[28], sqlite3BtreeLastPage(p->pSrc));
      }
    }
    sqlite3PagerUnref(pDestPg);
  }

  return rc;
}